

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawList::ImDrawList(ImDrawList *this,ImDrawListSharedData *shared_data)

{
  ImDrawCmd *in_RSI;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawListSplitter *this_00;
  
  ImVector<ImDrawCmd>::ImVector(in_RDI);
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)(in_RDI + 1));
  ImVector<ImDrawVert>::ImVector((ImVector<ImDrawVert> *)(in_RDI + 2));
  ImVector<ImVec4>::ImVector((ImVector<ImVec4> *)&in_RDI[5].Data);
  this_00 = (ImDrawListSplitter *)&in_RDI[6].Data;
  ImVector<void_*>::ImVector((ImVector<void_*> *)this_00);
  ImVector<ImVec2>::ImVector((ImVector<ImVec2> *)&in_RDI[7].Data);
  ImDrawCmdHeader::ImDrawCmdHeader((ImDrawCmdHeader *)0x14cc5e);
  ImDrawListSplitter::ImDrawListSplitter(this_00);
  memset(in_RDI,0,0xc0);
  in_RDI[3].Data = in_RSI;
  return;
}

Assistant:

ImDrawList(const ImDrawListSharedData* shared_data) { memset(this, 0, sizeof(*this)); _Data = shared_data; }